

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

int32 bio_readhdr(FILE *fp,char ***argname,char ***argval,int32 *swap)

{
  int32 *piVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  size_t sVar5;
  int32 iVar6;
  long lVar7;
  uint uVar8;
  undefined8 uVar9;
  ulong uVar10;
  int32 l;
  char word [4096];
  char line [16384];
  ulong local_9050;
  int local_9044;
  int32 *local_9040;
  char local_9038;
  undefined2 uStack_9037;
  int iStack_9035;
  char local_8038 [16384];
  uint local_4038;
  undefined4 uStack_4034;
  undefined7 uStack_4030;
  
  ppcVar3 = (char **)__ckd_calloc__(0x21,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                                    ,0xc2);
  *argname = ppcVar3;
  ppcVar3 = (char **)__ckd_calloc__(0x20,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                                    ,0xc3);
  *argval = ppcVar3;
  pcVar4 = fgets(local_8038,0x4000,(FILE *)fp);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "Premature EOF, line %d\n";
    lVar7 = 199;
    uVar9 = 0;
  }
  else {
    if (((local_8038[0] == 's') && (local_8038[1] == '3')) && (local_8038[2] == '\n')) {
      uVar8 = 1;
      local_9050 = 0;
      local_9040 = swap;
      while (pcVar4 = fgets(local_8038,0x4000,(FILE *)fp), pcVar4 != (char *)0x0) {
        uVar8 = uVar8 + 1;
        iVar2 = __isoc99_sscanf(local_8038,"%s%n",&local_9038,&local_9044);
        if (iVar2 != 1) {
          pcVar4 = "Header format error, line %d\n";
          lVar7 = 0xd6;
          goto LAB_001137e2;
        }
        if (iStack_9035 == 0x726468 &&
            CONCAT13((undefined1)iStack_9035,CONCAT21(uStack_9037,local_9038)) == 0x68646e65) {
          local_9050 = local_9050 & 0xffffffff;
          goto LAB_0011380e;
        }
        if (local_9038 != '#') {
          if (local_9050 == 0x20) {
            pcVar4 = "Max arg-value limit(%d) exceeded; increase BIO_HDRARG_MAX\n";
            lVar7 = 0xe1;
            uVar10 = 0x20;
            goto LAB_001137ea;
          }
          pcVar4 = __ckd_salloc__(&local_9038,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                                  ,0xe5);
          (*argname)[local_9050] = pcVar4;
          iVar2 = __isoc99_sscanf(local_8038 + local_9044,"%s",&local_9038);
          if (iVar2 != 1) {
            pcVar4 = "Header format error, line %d\n";
            lVar7 = 0xe7;
            goto LAB_001137e2;
          }
          pcVar4 = __ckd_salloc__(&local_9038,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                                  ,0xea);
          (*argval)[local_9050] = pcVar4;
          local_9050 = local_9050 + 1;
        }
      }
      pcVar4 = "Premature EOF, line %d\n";
      lVar7 = 0xd0;
LAB_001137e2:
      uVar10 = (ulong)uVar8;
LAB_001137ea:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
              ,lVar7,pcVar4,uVar10);
      goto LAB_00113905;
    }
    iVar2 = __isoc99_sscanf(local_8038,"%s",&local_9038);
    if (iVar2 == 1) {
      local_9040 = swap;
      pcVar4 = __ckd_salloc__("version",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                              ,0xf5);
      **argname = pcVar4;
      pcVar4 = __ckd_salloc__(&local_9038,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                              ,0xf6);
      **argval = pcVar4;
      do {
        pcVar4 = fgets((char *)&local_4038,0x4000,(FILE *)fp);
        if (pcVar4 == (char *)0x0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                  ,0x5a,"Missing %s marker\n","*end_comment*\n");
          exit(1);
        }
      } while (CONCAT71(uStack_4030,uStack_4034._3_1_) != 0xa2a746e656d6d ||
               CONCAT44(uStack_4034,local_4038) != 0x6d6f635f646e652a);
      local_9050 = 1;
LAB_0011380e:
      (*argname)[local_9050] = (char *)0x0;
      sVar5 = fread(&local_4038,4,1,(FILE *)fp);
      piVar1 = local_9040;
      if (sVar5 == 1) {
        iVar6 = 0;
        if (local_4038 == 0x11223344) {
LAB_00113865:
          *local_9040 = iVar6;
          return 0;
        }
        if (local_4038 == 0x44332211) {
          iVar6 = 1;
          goto LAB_00113865;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                ,0x71,"Bad BYTEORDER MAGIC NO: %08x, expecting %08x\n",(ulong)local_4038,0x11223344)
        ;
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                ,100,"Cannot read BYTEORDER MAGIC NO.\n");
      }
      *piVar1 = -1;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
              ,0xfe,"swap_check failed\n");
      goto LAB_00113905;
    }
    pcVar4 = "Header format error, line %d\n";
    lVar7 = 0xf1;
    uVar9 = 1;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
          ,lVar7,pcVar4,uVar9);
LAB_00113905:
  bio_hdrarg_free(*argname,*argval);
  *argval = (char **)0x0;
  *argname = (char **)0x0;
  return -1;
}

Assistant:

int32
bio_readhdr(FILE * fp, char ***argname, char ***argval, int32 * swap)
{
    __BIGSTACKVARIABLE__ char line[16384], word[4096];
    int32 i, l;
    int32 lineno;

    *argname = (char **) ckd_calloc(BIO_HDRARG_MAX + 1, sizeof(char *));
    *argval = (char **) ckd_calloc(BIO_HDRARG_MAX, sizeof(char *));

    lineno = 0;
    if (fgets(line, sizeof(line), fp) == NULL){
        E_ERROR("Premature EOF, line %d\n", lineno);
        goto error_out;
    }
    lineno++;

    if ((line[0] == 's') && (line[1] == '3') && (line[2] == '\n')) {
        /* New format (post Dec-1996, including checksums); read argument-value pairs */
        for (i = 0;;) {
            if (fgets(line, sizeof(line), fp) == NULL) {
                E_ERROR("Premature EOF, line %d\n", lineno);
                goto error_out;
            }
            lineno++;

            if (sscanf(line, "%s%n", word, &l) != 1) {
                E_ERROR("Header format error, line %d\n", lineno);
                goto error_out;
            }
            if (strcmp(word, "endhdr") == 0)
                break;
            if (word[0] == '#') /* Skip comments */
                continue;

            if (i >= BIO_HDRARG_MAX) {
                E_ERROR
                    ("Max arg-value limit(%d) exceeded; increase BIO_HDRARG_MAX\n",
                     BIO_HDRARG_MAX);
                goto error_out;
            }

            (*argname)[i] = ckd_salloc(word);
            if (sscanf(line + l, "%s", word) != 1) {      /* Multi-word values not allowed */
                E_ERROR("Header format error, line %d\n", lineno);
                goto error_out;
            }
            (*argval)[i] = ckd_salloc(word);
            i++;
        }
    }
    else {
        /* Old format (without checksums); the first entry must be the version# */
        if (sscanf(line, "%s", word) != 1) {
            E_ERROR("Header format error, line %d\n", lineno);
            goto error_out;
        }

        (*argname)[0] = ckd_salloc("version");
        (*argval)[0] = ckd_salloc(word);
        i = 1;

        bcomment_read(fp);
    }
    (*argname)[i] = NULL;

    if ((*swap = swap_check(fp)) < 0) {
        E_ERROR("swap_check failed\n");
        goto error_out;
    }

    return 0;
error_out:
    bio_hdrarg_free(*argname, *argval);
    *argname = *argval = NULL;
    return -1;
}